

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O0

fvar<double,_2UL> *
ising::free_energy::square::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (double Jx,double Jy,fvar<double,_2UL> beta)

{
  fvar<double,_2UL> beta_00;
  bool bVar1;
  invalid_argument *piVar2;
  fvar<double,_2UL> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  fvar<double,_2UL> *in_stack_00000008;
  fvar<double,_2UL> *in_stack_00000010;
  fvar<double,_2UL> logZ;
  tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  integrator;
  real_t_conflict pi;
  unsigned_long max_n;
  double in_stack_00000198;
  double in_stack_000001a0;
  double in_stack_000001a8;
  tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  *in_stack_000001b0;
  undefined1 in_stack_000001c0 [56];
  root_type *in_stack_fffffffffffffe88;
  fvar<double,_2UL> *in_stack_fffffffffffffe90;
  double in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed0;
  fvar<double,_2UL> *pfVar3;
  fvar<double,_2UL> *local_e0;
  fvar<double,_2UL> *pfStack_d8;
  
  if ((0.0 < (double)CONCAT44(in_XMM0_Db,in_XMM0_Da)) && (0.0 < in_XMM1_Qa)) {
    pfVar3 = in_RDI;
    bVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator<=
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    if (!bVar1) {
      boost::math::constants::pi<double>();
      boost::math::tools::min_value<double>();
      boost::math::quadrature::
      tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::tanh_sinh((tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                   *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,(double *)0x13571a)
      ;
      log(2.0);
      beta_00.v._M_elems[1] = (double)in_RDI;
      beta_00.v._M_elems[0] = (double)in_stack_fffffffffffffed0;
      beta_00.v._M_elems[2] = (double)pfVar3;
      (anonymous_namespace)::
      func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,beta_00);
      boost::math::tools::root_epsilon<double>();
      boost::math::quadrature::
      tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::
      integrate<ising::free_energy::square::(anonymous_namespace)::functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>_>
                (in_stack_000001b0,
                 (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
                  )in_stack_000001c0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
                 (double *)beta.v._M_elems[2],(double *)beta.v._M_elems[1],
                 (size_t *)beta.v._M_elems[0]);
      boost::math::differentiation::autodiff_v1::detail::operator*((root_type *)pfStack_d8,local_e0)
      ;
      boost::math::differentiation::autodiff_v1::detail::operator+((root_type *)pfStack_d8,local_e0)
      ;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator-(pfStack_d8);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
                (in_stack_00000010,in_stack_00000008);
      boost::math::quadrature::
      tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
      ::~tanh_sinh((tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                    *)0x13589a);
      return pfVar3;
    }
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"beta should be positive");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Jx and Jy should be positive");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Jx, T Jy, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  boost::math::quadrature::tanh_sinh<real_t> integrator;
  auto logZ = log(real_t(2)) / 2 +
              2 * integrator.integrate(func(Jx, Jy, beta), 0, pi / 2);
  return -logZ / beta;
}